

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TermAlgebra.cpp
# Opt level: O1

bool __thiscall Shell::TermAlgebra::emptyDomain(TermAlgebra *this)

{
  bool bVar1;
  ulong n;
  bool bVar2;
  
  if (this->_n == 0) {
    bVar2 = true;
  }
  else if (this->_allowsCyclicTerms == false) {
    bVar2 = this->_n == 0;
    if (!bVar2) {
      n = 0;
      do {
        if ((this->_constrs)._capacity <= n) {
          ::Lib::Array<Shell::TermAlgebraConstructor_*>::expandToFit(&this->_constrs,n);
        }
        bVar1 = TermAlgebraConstructor::recursive((this->_constrs)._array[n]);
        if (!bVar1) {
          return bVar2;
        }
        n = n + 1;
        bVar1 = n < this->_n;
        bVar2 = !bVar1;
      } while (bVar1);
    }
  }
  else {
    bVar2 = false;
  }
  return bVar2;
}

Assistant:

bool TermAlgebra::emptyDomain()
{
  if (_n == 0) {
    return true;
  }

  if (_allowsCyclicTerms) {
    return false;
  }

  for (unsigned i = 0; i < _n; i++) {
    if (!(_constrs[i]->recursive())) {
      return false;
    }
  }
  return true;
}